

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

string * __thiscall
duckdb::ParquetKeys::GetObjectType_abi_cxx11_(string *__return_storage_ptr__,ParquetKeys *this)

{
  ObjectType_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

string ParquetKeys::GetObjectType() {
	return ObjectType();
}